

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ProceduralCheckerStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ProceduralCheckerStatement,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Symbol_*,_18446744073709551615UL> *args,
          SourceRange *args_1)

{
  pointer ppSVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  ProceduralCheckerStatement *pPVar5;
  
  pPVar5 = (ProceduralCheckerStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ProceduralCheckerStatement *)this->endPtr < pPVar5 + 1) {
    pPVar5 = (ProceduralCheckerStatement *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pPVar5 + 1);
  }
  ppSVar1 = args->_M_ptr;
  sVar2 = (args->_M_extent)._M_extent_value;
  SVar3 = args_1->startLoc;
  SVar4 = args_1->endLoc;
  (pPVar5->super_Statement).kind = ProceduralChecker;
  (pPVar5->super_Statement).syntax = (StatementSyntax *)0x0;
  (pPVar5->super_Statement).sourceRange.startLoc = SVar3;
  (pPVar5->super_Statement).sourceRange.endLoc = SVar4;
  (pPVar5->instances)._M_ptr = ppSVar1;
  (pPVar5->instances)._M_extent._M_extent_value = sVar2;
  return pPVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }